

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

CURLcode Curl_urldecode(SessionHandle *data,char *string,size_t length,char **ostring,size_t *olen,
                       _Bool reject_ctrl)

{
  size_t sVar1;
  byte bVar2;
  CURLcode CVar3;
  char *pcVar4;
  ushort **ppuVar5;
  ulong ulnum;
  size_t sVar6;
  undefined3 in_register_00000089;
  char hexstr [3];
  char *ptr;
  byte local_4f;
  byte local_4e;
  undefined1 local_4d;
  undefined4 local_4c;
  char **local_48;
  size_t *local_40;
  char *local_38;
  
  local_4c = CONCAT31(in_register_00000089,reject_ctrl);
  local_40 = olen;
  if (length == 0) {
    length = strlen(string);
  }
  pcVar4 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar4 == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar6 = 0;
    sVar1 = length + 1;
    local_48 = ostring;
    for (; length != 0; length = length - 1) {
      bVar2 = *string;
      if ((2 < length) && (bVar2 == 0x25)) {
        ppuVar5 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar5 + (ulong)((byte *)string)[1] * 2 + 1) & 0x10) != 0) &&
           ((*(byte *)((long)*ppuVar5 + (ulong)((byte *)string)[2] * 2 + 1) & 0x10) != 0)) {
          local_4f = ((byte *)string)[1];
          local_4e = ((byte *)string)[2];
          local_4d = 0;
          ulnum = strtoul((char *)&local_4f,&local_38,0x10);
          bVar2 = curlx_ultouc(ulnum);
          length = sVar1 - 3;
          string = (char *)((byte *)string + 2);
        }
      }
      if (((char)local_4c != '\0') && (bVar2 < 0x20)) {
        (*Curl_cfree)(pcVar4);
        return CURLE_URL_MALFORMAT;
      }
      pcVar4[sVar6] = bVar2;
      sVar6 = sVar6 + 1;
      string = (char *)((byte *)string + 1);
      sVar1 = length;
    }
    pcVar4[sVar6] = '\0';
    if (local_40 != (size_t *)0x0) {
      *local_40 = sVar6;
    }
    *local_48 = pcVar4;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_urldecode(struct SessionHandle *data,
                        const char *string, size_t length,
                        char **ostring, size_t *olen,
                        bool reject_ctrl)
{
  size_t alloc = (length?length:strlen(string))+1;
  char *ns = malloc(alloc);
  unsigned char in;
  size_t strindex=0;
  unsigned long hex;
  CURLcode result;

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      result = Curl_convert_from_network(data, &in, 1);
      if(result) {
        /* Curl_convert_from_network calls failf if unsuccessful */
        free(ns);
        return result;
      }

      string+=2;
      alloc-=2;
    }

    if(reject_ctrl && (in < 0x20)) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex]=0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}